

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  bool bVar2;
  char *pcVar3;
  typed_value<unsigned_long,_char> *ptVar4;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar5;
  size_type sVar6;
  ostream *this;
  variable_value *pvVar7;
  unsigned_long *puVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  reference type_00;
  error *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *type;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_2c8;
  unsigned_long local_2a8;
  unsigned_long spread;
  string local_298;
  undefined1 local_278 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  types;
  string local_258;
  unsigned_long local_238;
  unsigned_long attempts;
  string local_228;
  unsigned_long local_208;
  unsigned_long size;
  key_type local_1f8;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d8;
  basic_parsed_options<char> local_1b8;
  variables_map local_190 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_180 [144];
  unsigned_long local_f0 [3];
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description description;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,anon_var_dwarf_1413d,&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help,h");
  ptVar4 = boost::program_options::value<unsigned_long>();
  local_f0[2] = 1000;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar4,local_f0 + 2);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)0x11f4a6,(char *)ptVar4);
  ptVar4 = boost::program_options::value<unsigned_long>();
  local_f0[1] = 1000;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar4,local_f0 + 1);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"attempts",(char *)ptVar4);
  ptVar5 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  ptVar5 = boost::program_options::
           typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
           ::multitoken(ptVar5);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"type",(char *)ptVar5);
  ptVar4 = boost::program_options::value<unsigned_long>();
  local_f0[0] = 1;
  ptVar4 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar4,local_f0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar3,(value_semantic *)"spread",(char *)ptVar4);
  boost::program_options::variables_map::variables_map(local_190);
  local_1d8.super_function_base.functor._8_8_ = 0;
  local_1d8.super_function_base.functor._16_8_ = 0;
  local_1d8.super_function_base.vtable = (vtable_base *)0x0;
  local_1d8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1d8);
  boost::program_options::parse_command_line<char>(&local_1b8,argc,argv,local_98,0,&local_1d8);
  boost::program_options::store((basic_parsed_options *)&local_1b8,local_190,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1b8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1d8);
  boost::program_options::notify(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"help",(allocator<char> *)((long)&size + 7));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_180,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"size",(allocator<char> *)((long)&attempts + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_190,&local_228);
    puVar8 = boost::program_options::variable_value::as<unsigned_long>(pvVar7);
    uVar1 = *puVar8;
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator((allocator<char> *)((long)&attempts + 7));
    local_208 = uVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"attempts",
               (allocator<char> *)
               ((long)&types.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_190,&local_258);
    puVar8 = boost::program_options::variable_value::as<unsigned_long>(pvVar7);
    uVar1 = *puVar8;
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&types.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_238 = uVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"type",(allocator<char> *)((long)&spread + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_190,&local_298);
    __x = boost::program_options::variable_value::
          as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_278,__x);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)((long)&spread + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c8,"spread",(allocator<char> *)((long)&__range2 + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_190,&local_2c8);
    puVar8 = boost::program_options::variable_value::as<unsigned_long>(pvVar7);
    uVar1 = *puVar8;
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    local_2a8 = uVar1;
    test_dyntuple_access(local_208,local_238);
    test_vector_access(local_208,local_238);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_278);
    type = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&type);
      if (!bVar2) break;
      type_00 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      test_pointer_array_access(local_208,local_238,type_00,local_2a8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278);
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  boost::program_options::variables_map::~variables_map(local_190);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("size", bpo::value<std::size_t>()->default_value(1000),
            "Размер испытываемых массивов.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("type", bpo::value<std::vector<std::string>>()->multitoken(),
            "Типы массива указателей.\nДопустимые значения: plain, sparse, shuffled.")
        ("spread", bpo::value<std::size_t>()->default_value(1),
            "Степень разреженности массива указателей.\n"
            "Создаёт массив указателей размера `size * spread`, который затем, в зависимости от "
            "выбранного типа массива, либо прореживается, либо перемешивается.\n"
            "В случае с простым (plain) массивом опция игнорируется.");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto size = vm["size"].as<std::size_t>();
            auto attempts = vm["attempts"].as<std::size_t>();
            auto types = vm["type"].as<std::vector<std::string>>();
            auto spread = vm["spread"].as<std::size_t>();

            test_dyntuple_access(size, attempts);
            test_vector_access(size, attempts);
            for (const auto & type: types)
            {
                test_pointer_array_access(size, attempts, type, spread);
            }
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}